

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

char * parson_strdup(char *string)

{
  size_t n;
  char *pcVar1;
  char *string_local;
  
  n = strlen(string);
  pcVar1 = parson_strndup(string,n);
  return pcVar1;
}

Assistant:

static char * parson_strdup(const char *string) {
    return parson_strndup(string, strlen(string));
}